

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *outb_local;
  
  if (in == (uchar *)0x0) {
    if (*outlen < 2) {
      *outlen = 0;
      *inlen = 0;
      outb_local._4_4_ = 0;
    }
    else {
      *outb = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      outb_local._4_4_ = 2;
    }
  }
  else {
    outb_local._4_4_ = UTF8ToUTF16LE(outb,outlen,in,inlen);
  }
  return outb_local._4_4_;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Added FFFE Byte Order Mark\n");
#endif
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen));
}